

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

deque<int,_ft::allocator<int>_> * __thiscall
ft::deque<int,_ft::allocator<int>_>::operator=
          (deque<int,_ft::allocator<int>_> *this,deque<int,_ft::allocator<int>_> *rhs)

{
  const_iterator local_68;
  const_iterator local_40;
  deque<int,_ft::allocator<int>_> *local_18;
  deque<int,_ft::allocator<int>_> *rhs_local;
  deque<int,_ft::allocator<int>_> *this_local;
  
  if (rhs != this) {
    local_18 = rhs;
    rhs_local = this;
    begin(&local_40,rhs);
    end(&local_68,local_18);
    deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
              ((deque<int,ft::allocator<int>> *)this,&local_40,&local_68,(type *)0x0);
    constDequeIterator<int,_64UL>::~constDequeIterator(&local_68);
    constDequeIterator<int,_64UL>::~constDequeIterator(&local_40);
  }
  return this;
}

Assistant:

deque&	operator=(deque const & rhs) {
		if (&rhs != this) {
			this->assign(rhs.begin(), rhs.end());
		}
		return *this;
	}